

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::InitialPass
          (cmFindPackageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  cmState *this_00;
  long lVar6;
  undefined7 extraout_var;
  _Base_ptr p_Var7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_01;
  int iVar10;
  pointer pbVar11;
  string exact;
  string disableFindPackageVar;
  allocator local_425;
  uint parsed_tweak;
  char *local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_408;
  ulong local_400;
  char *local_3f8;
  string *local_3f0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> configArgs;
  string components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignored;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doubledComponents;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> moduleArgs;
  string local_1c0;
  string local_1a0;
  string local_180;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionalComponents;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredComponents;
  RegularExpression version;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string
              ((string *)&ignored,"called with incorrect number of arguments",(allocator *)&version)
    ;
    cmCommand::SetError((cmCommand *)this,(string *)&ignored);
    std::__cxx11::string::~string((string *)&ignored);
    return false;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&ignored,"CMAKE_MINIMUM_REQUIRED_VERSION",(allocator *)&version);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&ignored);
  std::__cxx11::string::~string((string *)&ignored);
  if (pcVar5 != (char *)0x0) {
    ignored.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)ignored.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    ignored.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __isoc99_sscanf(pcVar5,"%u.%u.%u",&ignored,
                    (undefined1 *)
                    ((long)&ignored.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4));
    this->RequiredCMakeVersion =
         ((ulong)ignored.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff) % 100000000 +
         (((ulong)ignored.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 0x20) % 1000 +
         (ulong)((uint)ignored.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start * 1000)) * 100000000;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)&ignored,"CMAKE_FIND_DEBUG_MODE",(allocator *)&version);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&ignored);
  this->DebugMode = bVar2;
  std::__cxx11::string::~string((string *)&ignored);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&ignored,"CMAKE_LIBRARY_ARCHITECTURE",(allocator *)&version);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&ignored);
  std::__cxx11::string::~string((string *)&ignored);
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->LibraryArchitecture);
  }
  bVar2 = cmMakefile::PlatformIs64Bit((this->super_cmFindCommon).super_cmCommand.Makefile);
  if (bVar2) {
    this_00 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    std::__cxx11::string::string
              ((string *)&ignored,"FIND_LIBRARY_USE_LIB64_PATHS",(allocator *)&version);
    bVar2 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&ignored);
    std::__cxx11::string::~string((string *)&ignored);
    if (bVar2) {
      this->UseLib64Paths = true;
    }
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&ignored,"CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY",(allocator *)&version);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&ignored);
  std::__cxx11::string::~string((string *)&ignored);
  if (bVar2) {
    this->NoUserRegistry = true;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&ignored,"CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY",
             (allocator *)&version);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&ignored);
  std::__cxx11::string::~string((string *)&ignored);
  if (bVar2) {
    this->NoSystemRegistry = true;
  }
  cmFindCommon::SelectDefaultRootPathMode(&this->super_cmFindCommon);
  cmFindCommon::SelectDefaultMacMode(&this->super_cmFindCommon);
  local_410 = &this->Name;
  std::__cxx11::string::_M_assign((string *)local_410);
  components._M_dataplus._M_p = (pointer)&components.field_2;
  components._M_string_length = 0;
  components.field_2._M_local_buf[0] = '\0';
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header;
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header;
  optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  optionalComponents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&ignored,"",(allocator *)&version);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_cmFindCommon).SearchPathSuffixes,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored);
  local_3f8 = "";
  std::__cxx11::string::~string((string *)&ignored);
  cmsys::RegularExpression::RegularExpression(&version,"^[0-9.]+$");
  configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &configArgs._M_t._M_impl.super__Rb_tree_header._M_header;
  configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header;
  moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408 = &this->Configs;
  local_418 = &this->Names;
  local_3f0 = (string *)&this->Version;
  local_400 = 0;
  exact._M_dataplus._M_p._0_4_ = 1;
  iVar10 = 0;
  configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0035b3c9:
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) <=
      (ulong)(uint)exact._M_dataplus._M_p) goto LAB_0035b93a;
  bVar2 = std::operator==(pbVar11 + (uint)exact._M_dataplus._M_p,"QUIET");
  if (bVar2) {
    this->Quiet = true;
LAB_0035b420:
    iVar10 = 0;
    goto LAB_0035b494;
  }
  bVar2 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p,
                          "EXACT");
  if (bVar2) {
    this->VersionExact = true;
    goto LAB_0035b420;
  }
  bVar2 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p,
                          "MODULE");
  this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
             *)&moduleArgs;
  if (!bVar2) {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"CONFIG");
    this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
               *)&configArgs;
    if (bVar2) goto LAB_0035b489;
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NO_MODULE");
    this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
               *)&configArgs;
    if (bVar2) goto LAB_0035b489;
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"REQUIRED");
    if (bVar2) {
      this->Required = true;
LAB_0035b4dd:
      iVar10 = 1;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"COMPONENTS");
    if (bVar2) goto LAB_0035b4dd;
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"OPTIONAL_COMPONENTS");
    if (bVar2) {
      iVar10 = 2;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NAMES");
    if (bVar2) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&configArgs,(uint *)&exact);
      iVar10 = 3;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"PATHS");
    if (bVar2) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&configArgs,(uint *)&exact);
      iVar10 = 4;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"HINTS");
    if (bVar2) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&configArgs,(uint *)&exact);
      iVar10 = 7;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"PATH_SUFFIXES");
    if (bVar2) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&configArgs,(uint *)&exact);
      iVar10 = 5;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"CONFIGS");
    if (bVar2) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&configArgs,(uint *)&exact);
      iVar10 = 6;
      goto LAB_0035b494;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NO_POLICY_SCOPE");
    if (bVar2) {
      this->PolicyScope = false;
      goto LAB_0035b420;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NO_CMAKE_PACKAGE_REGISTRY");
    if (bVar2) {
      this->NoUserRegistry = true;
LAB_0035b67f:
      this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 *)&configArgs;
      goto LAB_0035b489;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NO_CMAKE_SYSTEM_PACKAGE_REGISTRY");
    if (bVar2) {
      this->NoSystemRegistry = true;
      goto LAB_0035b67f;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                            (uint)exact._M_dataplus._M_p,"NO_CMAKE_BUILDS_PATH");
    this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
               *)&configArgs;
    if (!bVar2) {
      bVar2 = cmFindCommon::CheckCommonArgument
                        (&this->super_cmFindCommon,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
      this_01 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 *)&configArgs;
      if (bVar2) goto LAB_0035b489;
      if (iVar10 - 1U < 2) {
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p;
        if (iVar10 == 2) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&optionalComponents,pbVar9);
          local_420 = "0";
        }
        else {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&requiredComponents,pbVar9);
          local_420 = "1";
        }
        std::operator+(&disableFindPackageVar,local_410,"_FIND_REQUIRED_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored
                       ,&disableFindPackageVar,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&disableFindPackageVar);
        AddFindDefinition(this,(string *)&ignored,local_420);
        std::__cxx11::string::append((char *)&components);
        std::__cxx11::string::append((string *)&components);
        std::__cxx11::string::~string((string *)&ignored);
        local_3f8 = ";";
      }
      else {
        switch(iVar10) {
        case 3:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_418,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
          iVar10 = 3;
          break;
        case 4:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&(this->super_cmFindCommon).UserGuessArgs,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
          iVar10 = 4;
          break;
        case 5:
          cmFindCommon::AddPathSuffix
                    (&this->super_cmFindCommon,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
          iVar10 = 5;
          break;
        case 6:
          lVar6 = std::__cxx11::string::find_first_of
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                     (uint)exact._M_dataplus._M_p),0x4ad379);
          if (lVar6 == -1) {
            cmsys::SystemTools::GetFilenameLastExtension
                      ((string *)&ignored,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ignored,".cmake");
            local_420 = (char *)CONCAT71(local_420._1_7_,bVar2);
            std::__cxx11::string::~string((string *)&ignored);
            if ((char)local_420 == '\0') {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_408,
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p)
              ;
              iVar10 = 6;
              break;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
          poVar8 = std::operator<<((ostream *)&ignored,
                                   "given CONFIGS option followed by invalid file name \"");
          poVar8 = std::operator<<(poVar8,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                          (uint)exact._M_dataplus._M_p));
          poVar8 = std::operator<<(poVar8,"\".  The names given must be file names without ");
          std::operator<<(poVar8,"a path and with a \".cmake\" extension.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError((cmCommand *)this,&disableFindPackageVar);
LAB_0035c452:
          std::__cxx11::string::~string((string *)&disableFindPackageVar);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ignored);
          bVar2 = false;
          goto LAB_0035bc74;
        case 7:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&(this->super_cmFindCommon).UserHintsArgs,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (uint)exact._M_dataplus._M_p);
          iVar10 = 7;
          break;
        default:
          if (((local_400 & 1) != 0) ||
             (bVar2 = cmsys::RegularExpression::find
                                (&version,(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start
                                          [(uint)exact._M_dataplus._M_p]._M_dataplus._M_p), !bVar2))
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
            poVar8 = std::operator<<((ostream *)&ignored,"called with invalid argument \"");
            poVar8 = std::operator<<(poVar8,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start +
                                            (uint)exact._M_dataplus._M_p));
            std::operator<<(poVar8,"\"");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError((cmCommand *)this,&disableFindPackageVar);
            goto LAB_0035c452;
          }
          local_400 = CONCAT71(extraout_var,1);
          std::__cxx11::string::_M_assign(local_3f0);
        }
      }
      goto LAB_0035b494;
    }
  }
LAB_0035b489:
  iVar10 = 0;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>(this_01,(uint *)&exact);
LAB_0035b494:
  exact._M_dataplus._M_p._0_4_ = (uint)exact._M_dataplus._M_p + 1;
  goto LAB_0035b3c9;
LAB_0035b93a:
  doubledComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  doubledComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  doubledComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (requiredComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &requiredComponents._M_t._M_impl.super__Rb_tree_header,
             optionalComponents._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &optionalComponents._M_t._M_impl.super__Rb_tree_header);
  pbVar9 = local_410;
  if (doubledComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      doubledComponents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->UseFindModules = configArgs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    this->UseConfigFiles = moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    if (moduleArgs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 ||
        configArgs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if ((this->Version)._M_string_length == 0) {
        if (this->VersionExact == true) {
          this->VersionExact = false;
          pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          std::__cxx11::string::string
                    ((string *)&ignored,"Ignoring EXACT since no version is requested.",
                     (allocator *)&disableFindPackageVar);
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&ignored,false);
          std::__cxx11::string::~string((string *)&ignored);
          if (((this->Version)._M_string_length != 0) && (components._M_string_length != 0))
          goto LAB_0035be5e;
        }
LAB_0035bd42:
        std::__cxx11::string::string((string *)&ignored,(string *)pbVar9);
        std::__cxx11::string::append((char *)&ignored);
        bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)&ignored);
        if (bVar2) {
          if ((this->Version)._M_string_length == 0) {
            std::__cxx11::string::string((string *)&disableFindPackageVar,(string *)pbVar9);
            std::__cxx11::string::append((char *)&disableFindPackageVar);
            cmMakefile::GetSafeDefinition
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&disableFindPackageVar);
            std::__cxx11::string::assign((char *)local_3f0);
            std::__cxx11::string::string((string *)&exact,(string *)pbVar9);
            std::__cxx11::string::append((char *)&exact);
            bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&exact);
            this->VersionExact = bVar2;
            std::__cxx11::string::~string((string *)&exact);
            std::__cxx11::string::~string((string *)&disableFindPackageVar);
          }
          if (components._M_string_length == 0) {
            std::operator+(&disableFindPackageVar,pbVar9,"_FIND_COMPONENTS");
            cmMakefile::GetSafeDefinition
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&disableFindPackageVar);
            std::__cxx11::string::assign((char *)&components);
            std::__cxx11::string::~string((string *)&disableFindPackageVar);
          }
        }
        std::__cxx11::string::~string((string *)&ignored);
        if ((this->Version)._M_string_length != 0) goto LAB_0035be5e;
      }
      else {
        if (components._M_string_length == 0) goto LAB_0035bd42;
LAB_0035be5e:
        uVar4 = __isoc99_sscanf((this->Version)._M_dataplus._M_p,"%u.%u.%u.%u",&ignored,
                                &disableFindPackageVar,&exact,&parsed_tweak);
        this->VersionCount = uVar4;
        switch(uVar4) {
        case 4:
          this->VersionTweak = parsed_tweak;
        case 3:
          this->VersionPatch = (uint)exact._M_dataplus._M_p;
        case 2:
          this->VersionMinor = (uint)disableFindPackageVar._M_dataplus._M_p;
        case 1:
          this->VersionMajor =
               (uint)ignored.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::__cxx11::string::string
                ((string *)&disableFindPackageVar,"CMAKE_DISABLE_FIND_PACKAGE_",
                 (allocator *)&ignored);
      std::__cxx11::string::append((string *)&disableFindPackageVar);
      bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                               &disableFindPackageVar);
      if (bVar2) {
        bVar2 = true;
        if (this->Required == true) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
          poVar8 = std::operator<<((ostream *)&ignored,"for module ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          poVar8 = std::operator<<(poVar8," called with REQUIRED, but ");
          poVar8 = std::operator<<(poVar8,(string *)&disableFindPackageVar);
          std::operator<<(poVar8," is enabled. A REQUIRED package cannot be disabled.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError((cmCommand *)this,&exact);
          std::__cxx11::string::~string((string *)&exact);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ignored);
          bVar2 = false;
        }
      }
      else {
        SetModuleVariables(this,&components);
        bVar3 = this->UseFindModules;
        if ((bool)bVar3 == true) {
          ignored.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)ignored.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          bVar2 = FindModule(this,(bool *)&ignored);
          if ((!bVar2) ||
             ((char)ignored.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == '\x01')) {
            AppendSuccessInformation(this);
            goto LAB_0035c2d9;
          }
          bVar3 = this->UseFindModules;
        }
        if (((bVar3 & 1) != 0) && (this->UseConfigFiles == true)) {
          pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          std::__cxx11::string::string
                    ((string *)&ignored,"CMAKE_FIND_PACKAGE_WARN_NO_MODULE",(allocator *)&exact);
          bVar2 = cmMakefile::IsOn(pcVar1,(string *)&ignored);
          std::__cxx11::string::~string((string *)&ignored);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
            if (this->RequiredCMakeVersion < 0x2ec09cd808) {
              poVar8 = std::operator<<((ostream *)&ignored,
                                       "find_package called without NO_MODULE option and no Find");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8,
                                       ".cmake module is in CMAKE_MODULE_PATH.  Add NO_MODULE to exclusively request Config mode and search for a package configuration file provided by "
                                      );
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8," (");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8,"Config.cmake or ");
              cmsys::SystemTools::LowerCase(&exact,pbVar9);
              poVar8 = std::operator<<(poVar8,(string *)&exact);
              poVar8 = std::operator<<(poVar8,"-config.cmake).  Otherwise make Find");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              std::operator<<(poVar8,".cmake available in CMAKE_MODULE_PATH.");
            }
            else {
              poVar8 = std::operator<<((ostream *)&ignored,
                                       "find_package called without either MODULE or CONFIG option and no Find"
                                      );
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8,
                                       ".cmake module is in CMAKE_MODULE_PATH.  Add MODULE to exclusively request Module mode and fail if Find"
                                      );
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8,
                                       ".cmake is missing.  Add CONFIG to exclusively request Config mode and search for a package configuration file provided by "
                                      );
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8," (");
              poVar8 = std::operator<<(poVar8,(string *)pbVar9);
              poVar8 = std::operator<<(poVar8,"Config.cmake or ");
              cmsys::SystemTools::LowerCase(&exact,pbVar9);
              poVar8 = std::operator<<(poVar8,(string *)&exact);
              std::operator<<(poVar8,"-config.cmake).  ");
            }
            std::__cxx11::string::~string((string *)&exact);
            std::operator<<((ostream *)&ignored,
                            "\n(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)");
            pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&exact,false);
            std::__cxx11::string::~string((string *)&exact);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ignored);
          }
        }
        std::__cxx11::string::_M_assign((string *)&this->Variable);
        std::__cxx11::string::append((char *)&this->Variable);
        if ((this->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_418,pbVar9);
        }
        if ((this->Configs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->Configs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          for (pbVar11 = (local_418->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              pbVar11 !=
              (this->Names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
            std::__cxx11::string::string((string *)&ignored,(string *)pbVar11);
            std::__cxx11::string::append((char *)&ignored);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_408,(value_type *)&ignored);
            cmsys::SystemTools::LowerCase(&exact,pbVar11);
            std::__cxx11::string::operator=((string *)&ignored,(string *)&exact);
            std::__cxx11::string::~string((string *)&exact);
            std::__cxx11::string::append((char *)&ignored);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_408,(value_type *)&ignored);
            std::__cxx11::string::~string((string *)&ignored);
          }
        }
        ignored.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ignored.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ignored.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmFindCommon::GetIgnoredPaths(&this->super_cmFindCommon,&ignored);
        cmFindCommon::RerootPaths(&this->super_cmFindCommon,&ignored);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->IgnoredPaths)._M_t);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->IgnoredPaths,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )ignored.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )ignored.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        bVar2 = HandlePackageMode(this);
        AppendSuccessInformation(this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ignored);
      }
LAB_0035c2d9:
      std::__cxx11::string::~string((string *)&disableFindPackageVar);
      goto LAB_0035bc67;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
    std::operator<<((ostream *)&ignored,"given options exclusive to Module mode:\n");
    for (p_Var7 = moduleArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &moduleArgs._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar8 = std::operator<<((ostream *)&ignored,"  ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                                      p_Var7[1]._M_color));
      std::operator<<(poVar8,"\n");
    }
    std::operator<<((ostream *)&ignored,"and options exclusive to Config mode:\n");
    for (p_Var7 = configArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &configArgs._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar8 = std::operator<<((ostream *)&ignored,"  ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                                      p_Var7[1]._M_color));
      std::operator<<(poVar8,"\n");
    }
    std::operator<<((ostream *)&ignored,"The options are incompatible.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&disableFindPackageVar);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ignored);
    std::operator<<((ostream *)&ignored,
                    "called with components that are both required and optional:\n");
    std::__cxx11::string::string((string *)&local_180,"  ",(allocator *)&exact);
    std::__cxx11::string::string((string *)&local_1a0,"",(allocator *)&parsed_tweak);
    std::__cxx11::string::string((string *)&local_1c0,"\n",&local_425);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&disableFindPackageVar,&local_180,&doubledComponents,&local_1a0,&local_1c0);
    poVar8 = std::operator<<((ostream *)&ignored,(string *)&disableFindPackageVar);
    std::operator<<(poVar8,"\n");
    std::__cxx11::string::~string((string *)&disableFindPackageVar);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError((cmCommand *)this,&disableFindPackageVar);
  }
  std::__cxx11::string::~string((string *)&disableFindPackageVar);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ignored);
  bVar2 = false;
LAB_0035bc67:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&doubledComponents);
LAB_0035bc74:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&moduleArgs._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&configArgs._M_t);
  cmsys::RegularExpression::~RegularExpression(&version);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&optionalComponents._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&requiredComponents._M_t);
  std::__cxx11::string::~string((string *)&components);
  return bVar2;
}

Assistant:

bool cmFindPackageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Lookup required version of CMake.
  if(const char* rv =
     this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION"))
    {
    unsigned int v[3] = {0,0,0};
    sscanf(rv, "%u.%u.%u", &v[0], &v[1], &v[2]);
    this->RequiredCMakeVersion = CMake_VERSION_ENCODE(v[0],v[1],v[2]);
    }

  // Check for debug mode.
  this->DebugMode = this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE");

  // Lookup target architecture, if any.
  if(const char* arch =
     this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE"))
    {
    this->LibraryArchitecture = arch;
    }

  // Lookup whether lib64 paths should be used.
  if(this->Makefile->PlatformIs64Bit() &&
     this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    this->UseLib64Paths = true;
    }

  // Check if User Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_PACKAGE_REGISTRY"))
    {
    this->NoUserRegistry = true;
    }

  // Check if System Package Registry should be disabled
  if(this->Makefile->IsOn("CMAKE_FIND_PACKAGE_NO_SYSTEM_PACKAGE_REGISTRY"))
    {
    this->NoSystemRegistry = true;
    }

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  // Record options.
  this->Name = args[0];
  std::string components;
  const char* components_sep = "";
  std::set<std::string> requiredComponents;
  std::set<std::string> optionalComponents;

  // Always search directly in a generated path.
  this->SearchPathSuffixes.push_back("");

  // Parse the arguments.
  enum Doing { DoingNone, DoingComponents, DoingOptionalComponents, DoingNames,
               DoingPaths, DoingPathSuffixes, DoingConfigs, DoingHints };
  Doing doing = DoingNone;
  cmsys::RegularExpression version("^[0-9.]+$");
  bool haveVersion = false;
  std::set<unsigned int> configArgs;
  std::set<unsigned int> moduleArgs;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "QUIET")
      {
      this->Quiet = true;
      doing = DoingNone;
      }
    else if(args[i] == "EXACT")
      {
      this->VersionExact = true;
      doing = DoingNone;
      }
    else if(args[i] == "MODULE")
      {
      moduleArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "CONFIG")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_MODULE")
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "REQUIRED")
      {
      this->Required = true;
      doing = DoingComponents;
      }
    else if(args[i] == "COMPONENTS")
      {
      doing = DoingComponents;
      }
    else if(args[i] == "OPTIONAL_COMPONENTS")
      {
      doing = DoingOptionalComponents;
      }
    else if(args[i] == "NAMES")
      {
      configArgs.insert(i);
      doing = DoingNames;
      }
    else if(args[i] == "PATHS")
      {
      configArgs.insert(i);
      doing = DoingPaths;
      }
    else if(args[i] == "HINTS")
      {
      configArgs.insert(i);
      doing = DoingHints;
      }
    else if(args[i] == "PATH_SUFFIXES")
      {
      configArgs.insert(i);
      doing = DoingPathSuffixes;
      }
    else if(args[i] == "CONFIGS")
      {
      configArgs.insert(i);
      doing = DoingConfigs;
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      this->PolicyScope = false;
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_PACKAGE_REGISTRY")
      {
      this->NoUserRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_SYSTEM_PACKAGE_REGISTRY")
      {
      this->NoSystemRegistry = true;
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(args[i] == "NO_CMAKE_BUILDS_PATH")
      {
      // Ignore legacy option.
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if(this->CheckCommonArgument(args[i]))
      {
      configArgs.insert(i);
      doing = DoingNone;
      }
    else if((doing == DoingComponents) || (doing == DoingOptionalComponents))
      {
      // Set a variable telling the find script whether this component
      // is required.
      const char* isRequired = "1";
      if (doing == DoingOptionalComponents)
        {
        isRequired = "0";
        optionalComponents.insert(args[i]);
        }
      else
        {
        requiredComponents.insert(args[i]);
        }

      std::string req_var = this->Name + "_FIND_REQUIRED_" + args[i];
      this->AddFindDefinition(req_var, isRequired);

      // Append to the list of required components.
      components += components_sep;
      components += args[i];
      components_sep = ";";
      }
    else if(doing == DoingNames)
      {
      this->Names.push_back(args[i]);
      }
    else if(doing == DoingPaths)
      {
      this->UserGuessArgs.push_back(args[i]);
      }
    else if(doing == DoingHints)
      {
      this->UserHintsArgs.push_back(args[i]);
      }
    else if(doing == DoingPathSuffixes)
      {
      this->AddPathSuffix(args[i]);
      }
    else if(doing == DoingConfigs)
      {
      if(args[i].find_first_of(":/\\") != args[i].npos ||
         cmSystemTools::GetFilenameLastExtension(args[i]) != ".cmake")
        {
        std::ostringstream e;
        e << "given CONFIGS option followed by invalid file name \""
          << args[i] << "\".  The names given must be file names without "
          << "a path and with a \".cmake\" extension.";
        this->SetError(e.str());
        return false;
        }
      this->Configs.push_back(args[i]);
      }
    else if(!haveVersion && version.find(args[i].c_str()))
      {
      haveVersion = true;
      this->Version = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "called with invalid argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  std::vector<std::string> doubledComponents;
  std::set_intersection(requiredComponents.begin(), requiredComponents.end(),
                        optionalComponents.begin(), optionalComponents.end(),
                        std::back_inserter(doubledComponents));
  if(!doubledComponents.empty())
    {
    std::ostringstream e;
    e << "called with components that are both required and optional:\n";
    e << cmWrap("  ", doubledComponents, "", "\n") << "\n";
    this->SetError(e.str());
    return false;
    }

  // Maybe choose one mode exclusively.
  this->UseFindModules = configArgs.empty();
  this->UseConfigFiles = moduleArgs.empty();
  if(!this->UseFindModules && !this->UseConfigFiles)
    {
    std::ostringstream e;
    e << "given options exclusive to Module mode:\n";
    for(std::set<unsigned int>::const_iterator si = moduleArgs.begin();
        si != moduleArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "and options exclusive to Config mode:\n";
    for(std::set<unsigned int>::const_iterator si = configArgs.begin();
        si != configArgs.end(); ++si)
      {
      e << "  " << args[*si] << "\n";
      }
    e << "The options are incompatible.";
    this->SetError(e.str());
    return false;
    }

  // Ignore EXACT with no version.
  if(this->Version.empty() && this->VersionExact)
    {
    this->VersionExact = false;
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING, "Ignoring EXACT since no version is requested.");
    }

  if(this->Version.empty() || components.empty())
    {
    // Check whether we are recursing inside "Find<name>.cmake" within
    // another find_package(<name>) call.
    std::string mod = this->Name;
    mod += "_FIND_MODULE";
    if(this->Makefile->IsOn(mod))
      {
      if(this->Version.empty())
        {
        // Get version information from the outer call if necessary.
        // Requested version string.
        std::string ver = this->Name;
        ver += "_FIND_VERSION";
        this->Version = this->Makefile->GetSafeDefinition(ver);

        // Whether an exact version is required.
        std::string exact = this->Name;
        exact += "_FIND_VERSION_EXACT";
        this->VersionExact = this->Makefile->IsOn(exact);
        }
      if(components.empty())
        {
        std::string components_var = this->Name + "_FIND_COMPONENTS";
        components = this->Makefile->GetSafeDefinition(components_var);
        }
      }
    }

  if(!this->Version.empty())
    {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    unsigned int parsed_major;
    unsigned int parsed_minor;
    unsigned int parsed_patch;
    unsigned int parsed_tweak;
    this->VersionCount = sscanf(this->Version.c_str(), "%u.%u.%u.%u",
                                &parsed_major, &parsed_minor,
                                &parsed_patch, &parsed_tweak);
    switch(this->VersionCount)
      {
      case 4: this->VersionTweak = parsed_tweak; // no break!
      case 3: this->VersionPatch = parsed_patch; // no break!
      case 2: this->VersionMinor = parsed_minor; // no break!
      case 1: this->VersionMajor = parsed_major; // no break!
      default: break;
      }
    }

  std::string disableFindPackageVar = "CMAKE_DISABLE_FIND_PACKAGE_";
  disableFindPackageVar += this->Name;
  if(this->Makefile->IsOn(disableFindPackageVar))
    {
    if (this->Required)
      {
      std::ostringstream e;
      e << "for module " << this->Name << " called with REQUIRED, but "
        << disableFindPackageVar
        << " is enabled. A REQUIRED package cannot be disabled.";
      this->SetError(e.str());
      return false;
      }

    return true;
    }


  this->SetModuleVariables(components);

  // See if there is a Find<package>.cmake module.
  if(this->UseFindModules)
    {
    bool foundModule = false;
    if(!this->FindModule(foundModule))
      {
      this->AppendSuccessInformation();
      return false;
      }
    if(foundModule)
      {
      this->AppendSuccessInformation();
      return true;
      }
    }

  if(this->UseFindModules && this->UseConfigFiles &&
     this->Makefile->IsOn("CMAKE_FIND_PACKAGE_WARN_NO_MODULE"))
    {
    std::ostringstream aw;
    if(this->RequiredCMakeVersion >= CMake_VERSION_ENCODE(2,8,8))
      {
      aw << "find_package called without either MODULE or CONFIG option and "
        "no Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add MODULE to exclusively request Module mode and fail if "
        "Find" << this->Name << ".cmake is missing.  "
        "Add CONFIG to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  ";
      }
    else
      {
      aw << "find_package called without NO_MODULE option and no "
        "Find" << this->Name << ".cmake module is in CMAKE_MODULE_PATH.  "
        "Add NO_MODULE to exclusively request Config mode and search for a "
        "package configuration file provided by " << this->Name <<
        " (" << this->Name << "Config.cmake or " <<
        cmSystemTools::LowerCase(this->Name) << "-config.cmake).  "
        "Otherwise make Find" << this->Name << ".cmake available in "
        "CMAKE_MODULE_PATH.";
      }
    aw << "\n"
      "(Variable CMAKE_FIND_PACKAGE_WARN_NO_MODULE enabled this warning.)";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, aw.str());
    }

  // No find module.  Assume the project has a CMake config file.  Use
  // a <package>_DIR cache variable to locate it.
  this->Variable = this->Name;
  this->Variable += "_DIR";

  // Add the default name.
  if(this->Names.empty())
    {
    this->Names.push_back(this->Name);
    }

  // Add the default configs.
  if(this->Configs.empty())
    {
    for(std::vector<std::string>::const_iterator ni = this->Names.begin();
        ni != this->Names.end(); ++ni)
      {
      std::string config = *ni;
      config += "Config.cmake";
      this->Configs.push_back(config);

      config = cmSystemTools::LowerCase(*ni);
      config += "-config.cmake";
      this->Configs.push_back(config);
      }
    }

  // get igonored paths from vars and reroot them.
  std::vector<std::string> ignored;
  this->GetIgnoredPaths(ignored);
  this->RerootPaths(ignored);

  // Construct a set of ignored paths
  this->IgnoredPaths.clear();
  this->IgnoredPaths.insert(ignored.begin(), ignored.end());

  // Find and load the package.
  bool result = this->HandlePackageMode();
  this->AppendSuccessInformation();
  return result;
}